

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void tcu::astc::anon_unknown_0::writeBlockMode(AssignBlock128 *dst,NormalBlockParams *blockParams)

{
  bool bVar1;
  deUint32 dVar2;
  deUint32 val;
  deUint32 val_00;
  deUint32 val_01;
  deUint32 val_02;
  deUint32 val_03;
  deUint32 val_04;
  long lVar3;
  deUint32 **local_b8;
  deUint32 **local_b0;
  deUint32 **local_a8;
  deUint32 **local_a0;
  deUint32 r2;
  deUint32 r1;
  deUint32 r0;
  deUint32 b1;
  deUint32 b0;
  deUint32 a1;
  deUint32 a0;
  deUint32 *heightVariable;
  deUint32 *widthVariable;
  deUint32 dummy;
  int heightMax;
  int widthMax;
  int heightMin;
  int widthMin;
  int variableOffsetsMax [3];
  int bMax;
  int aMax;
  BlockModeLayout *layout;
  int blockModeLayoutNdx;
  deUint32 b;
  deUint32 a;
  deUint32 h;
  deUint32 r;
  deUint32 d;
  NormalBlockParams *blockParams_local;
  AssignBlock128 *dst_local;
  
  h = blockParams->isDualPlane & 1;
  blockModeLayoutNdx = -1;
  layout._4_4_ = 0xffffffff;
  _r = blockParams;
  blockParams_local = (NormalBlockParams *)dst;
  dVar2 = computeISERangeMax(&blockParams->weightISEParams);
  switch(dVar2) {
  case 1:
    a = 2;
    b = 0;
    break;
  case 2:
    a = 3;
    b = 0;
    break;
  case 3:
    a = 4;
    b = 0;
    break;
  case 4:
    a = 5;
    b = 0;
    break;
  case 5:
    a = 6;
    b = 0;
    break;
  default:
    a = 0xffffffff;
    b = 0xffffffff;
    break;
  case 7:
    a = 7;
    b = 0;
    break;
  case 9:
    a = 2;
    b = 1;
    break;
  case 0xb:
    a = 3;
    b = 1;
    break;
  case 0xf:
    a = 4;
    b = 1;
    break;
  case 0x13:
    a = 5;
    b = 1;
    break;
  case 0x17:
    a = 6;
    b = 1;
    break;
  case 0x1f:
    a = 7;
    b = 1;
  }
  layout._0_4_ = 0;
  do {
    if (9 < (int)layout) {
LAB_01248035:
      dVar2 = getBit(blockModeLayoutNdx,0);
      val = getBit(blockModeLayoutNdx,1);
      val_00 = getBit(layout._4_4_,0);
      val_01 = getBit(layout._4_4_,1);
      val_02 = getBit(a,0);
      val_03 = getBit(a,1);
      val_04 = getBit(a,2);
      switch((int)layout) {
      case 0:
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,10,h);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,9,b);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,8,val_01);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,7,val_00);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,6,val);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,5,dVar2);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,4,val_02);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,3,0);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,2,0);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,1,val_04);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,0,val_03);
        break;
      case 1:
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,10,h);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,9,b);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,8,val_01);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,7,val_00);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,6,val);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,5,dVar2);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,4,val_02);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,3,0);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,2,1);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,1,val_04);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,0,val_03);
        break;
      case 2:
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,10,h);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,9,b);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,8,val_01);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,7,val_00);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,6,val);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,5,dVar2);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,4,val_02);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,3,1);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,2,0);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,1,val_04);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,0,val_03);
        break;
      case 3:
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,10,h);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,9,b);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,8,0);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,7,layout._4_4_);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,6,val);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,5,dVar2);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,4,val_02);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,3,1);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,2,1);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,1,val_04);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,0,val_03);
        break;
      case 4:
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,10,h);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,9,b);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,8,1);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,7,layout._4_4_);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,6,val);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,5,dVar2);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,4,val_02);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,3,1);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,2,1);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,1,val_04);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,0,val_03);
        break;
      case 5:
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,10,h);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,9,b);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,8,0);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,7,0);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,6,val);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,5,dVar2);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,4,val_02);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,3,val_04);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,2,val_03);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,1,0);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,0,0);
        break;
      case 6:
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,10,h);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,9,b);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,8,0);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,7,1);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,6,val);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,5,dVar2);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,4,val_02);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,3,val_04);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,2,val_03);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,1,0);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,0,0);
        break;
      case 7:
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,10,h);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,9,b);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,8,1);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,7,1);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,6,0);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,5,0);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,4,val_02);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,3,val_04);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,2,val_03);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,1,0);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,0,0);
        break;
      case 8:
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,10,h);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,9,b);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,8,1);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,7,1);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,6,0);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,5,1);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,4,val_02);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,3,val_04);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,2,val_03);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,1,0);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,0,0);
        break;
      case 9:
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,10,val_01);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,9,val_00);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,8,1);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,7,0);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,6,val);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,5,dVar2);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,4,val_02);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,3,val_04);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,2,val_03);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,1,0);
        AssignBlock128::setBit((AssignBlock128 *)blockParams_local,0,0);
      }
      return;
    }
    lVar3 = (long)(int)layout;
    variableOffsetsMax[2] =
         (1 << ((byte)writeBlockMode::blockModeLayouts[lVar3].aNumBits & 0x1f)) + -1;
    variableOffsetsMax[1] =
         (1 << ((byte)writeBlockMode::blockModeLayouts[lVar3].bNumBits & 0x1f)) + -1;
    heightMin = 0;
    widthMin = variableOffsetsMax[2];
    variableOffsetsMax[0] = variableOffsetsMax[1];
    widthMax = writeBlockMode::blockModeLayouts[lVar3].gridWidthConstantTerm;
    heightMax = writeBlockMode::blockModeLayouts[lVar3].gridHeightConstantTerm;
    dummy = widthMax + (&heightMin)[writeBlockMode::blockModeLayouts[lVar3].gridWidthVariableTerm];
    widthVariable._4_4_ =
         heightMax + (&heightMin)[writeBlockMode::blockModeLayouts[lVar3].gridHeightVariableTerm];
    bVar1 = de::inRange<int>(_r->weightGridWidth,widthMax,dummy);
    if ((bVar1) &&
       (bVar1 = de::inRange<int>(_r->weightGridHeight,heightMax,widthVariable._4_4_), bVar1)) {
      widthVariable._0_4_ = 0;
      if (writeBlockMode::blockModeLayouts[lVar3].gridWidthVariableTerm == A) {
        local_a0 = (deUint32 **)&blockModeLayoutNdx;
      }
      else {
        if (writeBlockMode::blockModeLayouts[lVar3].gridWidthVariableTerm == B) {
          local_a8 = (deUint32 **)((long)&layout + 4);
        }
        else {
          local_a8 = &widthVariable;
        }
        local_a0 = local_a8;
      }
      if (writeBlockMode::blockModeLayouts[lVar3].gridHeightVariableTerm == A) {
        local_b0 = (deUint32 **)&blockModeLayoutNdx;
      }
      else {
        if (writeBlockMode::blockModeLayouts[lVar3].gridHeightVariableTerm == B) {
          local_b8 = (deUint32 **)((long)&layout + 4);
        }
        else {
          local_b8 = &widthVariable;
        }
        local_b0 = local_b8;
      }
      *(int *)local_a0 =
           _r->weightGridWidth - writeBlockMode::blockModeLayouts[lVar3].gridWidthConstantTerm;
      *(int *)local_b0 =
           _r->weightGridHeight - writeBlockMode::blockModeLayouts[lVar3].gridHeightConstantTerm;
      goto LAB_01248035;
    }
    layout._0_4_ = (int)layout + 1;
  } while( true );
}

Assistant:

static void writeBlockMode (AssignBlock128& dst, const NormalBlockParams& blockParams)
{
	const deUint32	d = blockParams.isDualPlane != 0;
	// r and h initialized in switch below.
	deUint32		r;
	deUint32		h;
	// a, b and blockModeLayoutNdx initialized in block mode layout index detecting loop below.
	deUint32		a = (deUint32)-1;
	deUint32		b = (deUint32)-1;
	int				blockModeLayoutNdx;

	// Find the values of r and h (ISE range).
	switch (computeISERangeMax(blockParams.weightISEParams))
	{
		case 1:		r = 2; h = 0;	break;
		case 2:		r = 3; h = 0;	break;
		case 3:		r = 4; h = 0;	break;
		case 4:		r = 5; h = 0;	break;
		case 5:		r = 6; h = 0;	break;
		case 7:		r = 7; h = 0;	break;

		case 9:		r = 2; h = 1;	break;
		case 11:	r = 3; h = 1;	break;
		case 15:	r = 4; h = 1;	break;
		case 19:	r = 5; h = 1;	break;
		case 23:	r = 6; h = 1;	break;
		case 31:	r = 7; h = 1;	break;

		default:
			DE_ASSERT(false);
			r = (deUint32)-1;
			h = (deUint32)-1;
	}

	// Find block mode layout index, i.e. appropriate row in the "2d block mode layout" table in ASTC spec.

	{
		enum BlockModeLayoutABVariable { Z=0, A=1, B=2 };

		static const struct BlockModeLayout
		{
			int							aNumBits;
			int							bNumBits;
			BlockModeLayoutABVariable	gridWidthVariableTerm;
			int							gridWidthConstantTerm;
			BlockModeLayoutABVariable	gridHeightVariableTerm;
			int							gridHeightConstantTerm;
		} blockModeLayouts[] =
		{
			{ 2, 2,   B,  4,   A,  2},
			{ 2, 2,   B,  8,   A,  2},
			{ 2, 2,   A,  2,   B,  8},
			{ 2, 1,   A,  2,   B,  6},
			{ 2, 1,   B,  2,   A,  2},
			{ 2, 0,   Z, 12,   A,  2},
			{ 2, 0,   A,  2,   Z, 12},
			{ 0, 0,   Z,  6,   Z, 10},
			{ 0, 0,   Z, 10,   Z,  6},
			{ 2, 2,   A,  6,   B,  6}
		};

		for (blockModeLayoutNdx = 0; blockModeLayoutNdx < DE_LENGTH_OF_ARRAY(blockModeLayouts); blockModeLayoutNdx++)
		{
			const BlockModeLayout&	layout					= blockModeLayouts[blockModeLayoutNdx];
			const int				aMax					= (1 << layout.aNumBits) - 1;
			const int				bMax					= (1 << layout.bNumBits) - 1;
			const int				variableOffsetsMax[3]	= { 0, aMax, bMax };
			const int				widthMin				= layout.gridWidthConstantTerm;
			const int				heightMin				= layout.gridHeightConstantTerm;
			const int				widthMax				= widthMin  + variableOffsetsMax[layout.gridWidthVariableTerm];
			const int				heightMax				= heightMin + variableOffsetsMax[layout.gridHeightVariableTerm];

			DE_ASSERT(layout.gridWidthVariableTerm != layout.gridHeightVariableTerm || layout.gridWidthVariableTerm == Z);

			if (de::inRange(blockParams.weightGridWidth, widthMin, widthMax) &&
				de::inRange(blockParams.weightGridHeight, heightMin, heightMax))
			{
				deUint32	dummy			= 0;
				deUint32&	widthVariable	= layout.gridWidthVariableTerm == A  ? a : layout.gridWidthVariableTerm == B  ? b : dummy;
				deUint32&	heightVariable	= layout.gridHeightVariableTerm == A ? a : layout.gridHeightVariableTerm == B ? b : dummy;

				widthVariable	= blockParams.weightGridWidth  - layout.gridWidthConstantTerm;
				heightVariable	= blockParams.weightGridHeight - layout.gridHeightConstantTerm;

				break;
			}
		}
	}

	// Set block mode bits.

	const deUint32 a0 = getBit(a, 0);
	const deUint32 a1 = getBit(a, 1);
	const deUint32 b0 = getBit(b, 0);
	const deUint32 b1 = getBit(b, 1);
	const deUint32 r0 = getBit(r, 0);
	const deUint32 r1 = getBit(r, 1);
	const deUint32 r2 = getBit(r, 2);

#define SB(NDX, VAL) dst.setBit((NDX), (VAL))
#define ASSIGN_BITS(B10, B9, B8, B7, B6, B5, B4, B3, B2, B1, B0) do { SB(10,(B10)); SB(9,(B9)); SB(8,(B8)); SB(7,(B7)); SB(6,(B6)); SB(5,(B5)); SB(4,(B4)); SB(3,(B3)); SB(2,(B2)); SB(1,(B1)); SB(0,(B0)); } while (false)

	switch (blockModeLayoutNdx)
	{
		case 0: ASSIGN_BITS(d,  h,  b1, b0, a1, a0, r0, 0,  0,  r2, r1);									break;
		case 1: ASSIGN_BITS(d,  h,  b1, b0, a1, a0, r0, 0,  1,  r2, r1);									break;
		case 2: ASSIGN_BITS(d,  h,  b1, b0, a1, a0, r0, 1,  0,  r2, r1);									break;
		case 3: ASSIGN_BITS(d,  h,   0,  b, a1, a0, r0, 1,  1,  r2, r1);									break;
		case 4: ASSIGN_BITS(d,  h,   1,  b, a1, a0, r0, 1,  1,  r2, r1);									break;
		case 5: ASSIGN_BITS(d,  h,   0,  0, a1, a0, r0, r2, r1,  0,  0);									break;
		case 6: ASSIGN_BITS(d,  h,   0,  1, a1, a0, r0, r2, r1,  0,  0);									break;
		case 7: ASSIGN_BITS(d,  h,   1,  1,  0,  0, r0, r2, r1,  0,  0);									break;
		case 8: ASSIGN_BITS(d,  h,   1,  1,  0,  1, r0, r2, r1,  0,  0);									break;
		case 9: ASSIGN_BITS(b1, b0,  1,  0, a1, a0, r0, r2, r1,  0,  0); DE_ASSERT(d == 0 && h == 0);		break;
		default:
			DE_ASSERT(false);
	}

#undef ASSIGN_BITS
#undef SB
}